

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UT_OK.cpp
# Opt level: O2

void __thiscall too_many_params::test_method(too_many_params *this)

{
  allocator local_a1;
  string local_a0 [32];
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  char *local_38;
  
  std::__cxx11::string::string(local_a0,"foo",&local_a1);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x29);
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_00115a38;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_78 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (&local_50,&local_80,0x29,1,2,local_a0,"a","foo","\"foo\"");
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::string(local_a0,"foo",&local_a1);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x2e);
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_00115a38;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_78 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (&local_50,&local_80,0x2e,1,2,local_a0,"a","foo","\"foo\"");
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

void f_copy_no_default1(F checks, Args&& ...args)
{
    auto a = na::get("a"_na, std::forward<Args>(args)...);
    checks(a);
}